

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O0

size_t __thiscall
bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>::rank
          (bitvector_t<4096UL,_(bv::allocation_policy_t)0> *this,size_t index,bool bit)

{
  byte in_DL;
  long in_RSI;
  size_t in_stack_00000018;
  size_t in_stack_00000020;
  bt_impl<4096UL,_(bv::allocation_policy_t)0> *in_stack_00000028;
  subtree_const_ref in_stack_00000040;
  size_t rank;
  bt_impl<4096UL,_(bv::allocation_policy_t)0> *in_stack_ffffffffffffff60;
  undefined8 local_20;
  
  std::
  unique_ptr<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
  ::operator->((unique_ptr<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                *)0x162304);
  std::
  unique_ptr<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
  ::operator->((unique_ptr<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                *)0x162313);
  internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::root(in_stack_ffffffffffffff60);
  internal::bt_impl::subtree_ref::operator_cast_to_subtree_ref_base
            ((subtree_ref *)in_stack_ffffffffffffff60);
  local_20 = internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::getrank
                       (in_stack_00000028,in_stack_00000040,in_stack_00000020,in_stack_00000018);
  if ((in_DL & 1) == 0) {
    local_20 = in_RSI - local_20;
  }
  return local_20;
}

Assistant:

inline
    size_t bitvector_t<W, AP>::rank(size_t index, bool bit) const
    {
        assert(valid() && "Can't access an uninitialized vector");
        size_t rank = _impl->getrank(_impl->root(), index, 0);

        if(!bit)
            rank = index - rank;
            
        return rank;
    }